

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

bool __thiscall
Catch::ConsoleReporter::assertionEnded(ConsoleReporter *this,AssertionStats *_assertionStats)

{
  OfType OVar1;
  pointer pcVar2;
  int iVar3;
  long lVar4;
  ostream *poVar5;
  ostream *poVar6;
  char *pcVar7;
  pointer pMVar8;
  AssertionStats *pAVar9;
  bool bVar10;
  Colour colourGuard_3;
  Colour colourGuard_1;
  ConsoleAssertionPrinter printer;
  Colour colourGuard;
  char local_121;
  undefined1 local_120 [32];
  size_t local_100;
  ostream *local_f0;
  AssertionStats *local_e8;
  AssertionResult *local_e0;
  Code local_d8;
  char *local_d0;
  char *local_c8;
  char local_c0;
  undefined7 uStack_bf;
  char *local_b0;
  char *local_a8;
  char local_a0;
  undefined7 uStack_9f;
  long *local_90 [2];
  long local_80 [2];
  vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> local_70;
  char local_58;
  string local_50;
  
  pAVar9 = _assertionStats;
  iVar3 = (*(((this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_config.
              super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_NonCopyable)._vptr_NonCopyable[5])();
  local_58 = '\x01';
  if (((char)iVar3 == '\0') &&
     (((OVar1 = (_assertionStats->assertionResult).m_resultData.resultType,
       (OVar1 & FailureBit) == Ok ||
       (((_assertionStats->assertionResult).m_info.resultDisposition & SuppressFail) != 0)) &&
      (local_58 = '\0', OVar1 != Warning)))) {
    return false;
  }
  TablePrinter::close((this->m_tablePrinter)._M_t.
                      super___uniq_ptr_impl<Catch::TablePrinter,_std::default_delete<Catch::TablePrinter>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Catch::TablePrinter_*,_std::default_delete<Catch::TablePrinter>_>
                      .super__Head_base<0UL,_Catch::TablePrinter_*,_false>._M_head_impl,(int)pAVar9)
  ;
  lazyPrintWithoutClosingBenchmarkTable(this);
  local_f0 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  local_d0 = &local_c0;
  local_d8 = None;
  local_c8 = (char *)0x0;
  local_c0 = '\0';
  local_b0 = &local_a0;
  local_a8 = (char *)0x0;
  local_a0 = '\0';
  local_90[0] = local_80;
  pcVar2 = (_assertionStats->assertionResult).m_resultData.message._M_dataplus._M_p;
  local_e8 = _assertionStats;
  local_e0 = &_assertionStats->assertionResult;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_90,pcVar2,
             pcVar2 + (_assertionStats->assertionResult).m_resultData.message._M_string_length);
  clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::vector
            (&local_70,&_assertionStats->infoMessages);
  OVar1 = (local_e0->m_resultData).resultType;
  if (ExpressionFailed < OVar1) {
    if (OVar1 < ThrewException) {
      if (OVar1 != ExplicitFailure) {
        if (OVar1 != Exception) goto LAB_007d29e5;
        goto switchD_007d2695_caseD_ffffffff;
      }
      std::__cxx11::string::_M_replace((ulong)&local_d0,0,local_c8,0x9550d9);
      local_d8 = BrightRed;
      lVar4 = (long)(_assertionStats->infoMessages).
                    super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(_assertionStats->infoMessages).
                    super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                    _M_impl.super__Vector_impl_data._M_start;
      if (lVar4 == 0x48) {
        std::__cxx11::string::_M_replace((ulong)&local_b0,0,local_a8,0x9557fe);
        lVar4 = (long)(_assertionStats->infoMessages).
                      super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(_assertionStats->infoMessages).
                      super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                      _M_impl.super__Vector_impl_data._M_start;
      }
      if ((ulong)((lVar4 >> 3) * -0x71c71c71c71c71c7) < 2) goto LAB_007d29e5;
      pcVar7 = "explicitly with messages";
    }
    else {
      if (OVar1 == ThrewException) {
        local_d8 = BrightRed;
        std::__cxx11::string::_M_replace((ulong)&local_d0,0,local_c8,0x9550d9);
        std::__cxx11::string::_M_replace((ulong)&local_b0,0,local_a8,0x955786);
        lVar4 = (long)(_assertionStats->infoMessages).
                      super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(_assertionStats->infoMessages).
                      super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                      _M_impl.super__Vector_impl_data._M_start;
        if (lVar4 == 0x48) {
          std::__cxx11::string::append((char *)&local_b0);
          lVar4 = (long)(_assertionStats->infoMessages).
                        super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)(_assertionStats->infoMessages).
                        super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                        _M_impl.super__Vector_impl_data._M_start;
        }
        if (1 < (ulong)((lVar4 >> 3) * -0x71c71c71c71c71c7)) {
          std::__cxx11::string::append((char *)&local_b0);
        }
        goto LAB_007d29e5;
      }
      if (OVar1 == DidntThrowException) {
        local_d8 = BrightRed;
        std::__cxx11::string::_M_replace((ulong)&local_d0,0,local_c8,0x9550d9);
        pcVar7 = "because no exception was thrown where one was expected";
      }
      else {
        if (OVar1 != FatalErrorCondition) goto LAB_007d29e5;
        local_d8 = BrightRed;
        std::__cxx11::string::_M_replace((ulong)&local_d0,0,local_c8,0x9550d9);
        pcVar7 = "due to a fatal error condition";
      }
    }
    goto LAB_007d29d3;
  }
  switch(OVar1) {
  case Ok:
    local_d8 = Green;
    std::__cxx11::string::_M_replace((ulong)&local_d0,0,local_c8,0x95576b);
    lVar4 = (long)(_assertionStats->infoMessages).
                  super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(_assertionStats->infoMessages).
                  super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    if (lVar4 == 0x48) {
      std::__cxx11::string::_M_replace((ulong)&local_b0,0,local_a8,0x955809);
LAB_007d27de:
      lVar4 = (long)(_assertionStats->infoMessages).
                    super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(_assertionStats->infoMessages).
                    super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                    _M_impl.super__Vector_impl_data._M_start;
    }
LAB_007d27ee:
    if ((ulong)((lVar4 >> 3) * -0x71c71c71c71c71c7) < 2) goto LAB_007d29e5;
    pcVar7 = "with messages";
    break;
  case Info:
    pcVar7 = "info";
    break;
  case Warning:
    pcVar7 = "warning";
    break;
  case Unknown:
    goto switchD_007d2695_caseD_ffffffff;
  default:
    if (OVar1 != FailureBit) {
      if (OVar1 != ExpressionFailed) goto LAB_007d29e5;
      bVar10 = ((local_e0->m_info).resultDisposition & SuppressFail) == 0;
      local_d8 = Green;
      if (bVar10) {
        local_d8 = BrightRed;
      }
      pcVar7 = "FAILED - but was ok";
      if (bVar10) {
        pcVar7 = "FAILED";
      }
      std::__cxx11::string::_M_replace((ulong)&local_d0,0,local_c8,(ulong)pcVar7);
      lVar4 = (long)(_assertionStats->infoMessages).
                    super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(_assertionStats->infoMessages).
                    super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                    _M_impl.super__Vector_impl_data._M_start;
      if (lVar4 == 0x48) {
        std::__cxx11::string::_M_replace((ulong)&local_b0,0,local_a8,0x955809);
        goto LAB_007d27de;
      }
      goto LAB_007d27ee;
    }
    goto switchD_007d2695_caseD_ffffffff;
  }
LAB_007d29d3:
  std::__cxx11::string::_M_replace((ulong)&local_b0,0,local_a8,(ulong)pcVar7);
LAB_007d29e5:
  local_50._M_dataplus._M_p._0_1_ = 0;
  Colour::use(FileName);
  poVar6 = local_f0;
  local_120._0_8_ = (local_e0->m_info).lineInfo.file;
  local_120._8_8_ = (local_e0->m_info).lineInfo.line;
  Catch::operator<<(local_f0,(SourceLineInfo *)local_120);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar6,": ",2);
  Colour::use(None);
  if ((local_e8->totals).assertions.failed + (local_e8->totals).assertions.passed +
      (local_e8->totals).assertions.failedButOk == 0) {
    local_120[0] = 10;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_f0,local_120,1);
  }
  else {
    if (local_c8 != (char *)0x0) {
      local_120._0_8_ = (ulong)(uint7)local_120._1_7_ << 8;
      Colour::use(local_d8);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_f0,local_d0,(long)local_c8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,":\n",2);
      Colour::use(None);
    }
    if ((local_e0->m_info).capturedExpression.m_size != 0) {
      local_50._M_dataplus._M_p._0_1_ = 0;
      Colour::use(Cyan);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_f0,"  ",2);
      poVar6 = local_f0;
      AssertionResult::getExpressionInMacro_abi_cxx11_((string *)local_120,local_e0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar6,(char *)local_120._0_8_,local_120._8_8_);
      if ((undefined1 *)local_120._0_8_ != local_120 + 0x10) {
        operator_delete((void *)local_120._0_8_,local_120._16_8_ + 1);
      }
      local_120[0] = 10;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_f0,local_120,1);
      Colour::use(None);
    }
    bVar10 = AssertionResult::hasExpandedExpression(local_e0);
    if (bVar10) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_f0,"with expansion:\n",0x10);
      Colour::use(BrightYellow);
      poVar6 = local_f0;
      AssertionResult::getExpandedExpression_abi_cxx11_(&local_50,local_e0);
      clara::TextFlow::Column::Column((Column *)local_120,&local_50);
      local_100 = 2;
      poVar6 = clara::TextFlow::operator<<(poVar6,(Column *)local_120);
      local_121 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar6,&local_121,1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_120);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_50._M_dataplus._M_p._1_7_,local_50._M_dataplus._M_p._0_1_) !=
          &local_50.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_50._M_dataplus._M_p._1_7_,local_50._M_dataplus._M_p._0_1_),
                        local_50.field_2._M_allocated_capacity + 1);
      }
      Colour::use(None);
    }
  }
  if (local_a8 != (char *)0x0) {
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_f0,local_b0,(long)local_a8);
    local_120[0] = ':';
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_120,1);
    local_120[0] = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_120,1);
  }
  if (local_70.super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_70.super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pMVar8 = local_70.super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
             _M_impl.super__Vector_impl_data._M_start;
    do {
      poVar6 = local_f0;
      if ((local_58 != '\0') || (pMVar8->type != Info)) {
        clara::TextFlow::Column::Column((Column *)local_120,&pMVar8->message);
        local_100 = 2;
        poVar6 = clara::TextFlow::operator<<(poVar6,(Column *)local_120);
        local_50._M_dataplus._M_p._0_1_ = 10;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar6,(char *)&local_50,1);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_120);
      }
      pMVar8 = pMVar8 + 1;
    } while (pMVar8 != local_70.
                       super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
  }
  local_120[0] = 10;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,local_120
             ,1);
  clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::~vector(&local_70);
  if (local_90[0] != local_80) {
    operator_delete(local_90[0],local_80[0] + 1);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,CONCAT71(uStack_9f,local_a0) + 1);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,CONCAT71(uStack_bf,local_c0) + 1);
  }
  return true;
switchD_007d2695_caseD_ffffffff:
  std::__cxx11::string::_M_replace((ulong)&local_d0,0,local_c8,0x955655);
  local_d8 = BrightRed;
  goto LAB_007d29e5;
}

Assistant:

bool ConsoleReporter::assertionEnded(AssertionStats const& _assertionStats) {
    AssertionResult const& result = _assertionStats.assertionResult;

    bool includeResults = m_config->includeSuccessfulResults() || !result.isOk();

    // Drop out if result was successful but we're not printing them.
    if (!includeResults && result.getResultType() != ResultWas::Warning)
        return false;

    lazyPrint();

    ConsoleAssertionPrinter printer(stream, _assertionStats, includeResults);
    printer.print();
    stream << '\n';
    return true;
}